

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::anon_unknown_14::TileProcess::run_decode
          (TileProcess *this,exr_const_context_t ctxt,int pn,DeepFrameBuffer *outfb,
          vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *filllist)

{
  exr_decode_pipeline_t *peVar1;
  uint16_t *puVar2;
  double dVar3;
  bool bVar4;
  uint uVar5;
  PixelType PVar6;
  exr_coding_channel_info_t *peVar7;
  size_t sVar8;
  size_t sVar9;
  int32_t *piVar10;
  pointer pDVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  char cVar24;
  undefined1 auVar25 [16];
  int iVar26;
  DeepSlice *pDVar27;
  Slice *pSVar28;
  pointer pDVar29;
  ArgExc *this_00;
  char *pcVar30;
  IoExc *this_01;
  undefined4 uVar31;
  ulong uVar32;
  float fVar33;
  uint uVar34;
  long lVar35;
  long lVar36;
  int32_t *piVar37;
  long lVar38;
  code *pcVar39;
  long lVar40;
  long *plVar41;
  ushort uVar42;
  undefined *puVar43;
  long lVar44;
  uint *fillptr;
  long *plVar45;
  ulong uVar46;
  long lVar47;
  ulong uVar48;
  int32_t *piVar49;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar65;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar79;
  int iVar82;
  int iVar83;
  undefined1 auVar80 [16];
  int iVar84;
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  int tileY;
  int tileX;
  exr_attr_box2i_t dw;
  stringstream _iex_throw_s;
  int local_208;
  int local_200;
  int local_1e0;
  int local_1dc;
  vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *local_1d8;
  exr_decode_pipeline_t *local_1d0;
  int local_1c8;
  int local_1c4;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  long lVar73;
  
  peVar1 = &this->decoder;
  if (this->first == true) {
    iVar26 = exr_decoding_initialize(ctxt,pn,&this->cinfo,peVar1);
    if (iVar26 == 0) {
      puVar2 = &(this->decoder).decode_flags;
      *(byte *)puVar2 = (byte)*puVar2 | 3;
      this->first = false;
      uVar42 = 0;
LAB_00170519:
      iVar26 = exr_get_data_window(ctxt,pn,&local_1c8);
      if (iVar26 == 0) {
        local_1d8 = filllist;
        local_1d0 = peVar1;
        iVar26 = exr_get_tile_sizes(ctxt,pn,(this->cinfo).level_x,(this->cinfo).level_y,&local_1dc,
                                    &local_1e0);
        if (iVar26 == 0) {
          lVar35 = (long)(this->cinfo).start_x * (long)local_1dc + (long)local_1c8;
          lVar36 = (long)(this->cinfo).start_y * (long)local_1e0 + (long)local_1c4;
          (this->decoder).decode_flags =
               ((this->decoder).decode_flags & 0xfffb) + (ushort)this->counts_only * 4;
          (this->decoder).user_line_begin_skip = 0;
          (this->decoder).user_line_end_ignore = 0;
          if (0 < (this->decoder).channel_count) {
            lVar40 = 0x28;
            lVar47 = 0;
            do {
              peVar7 = (this->decoder).channels;
              pDVar27 = DeepFrameBuffer::findSlice(outfb,*(char **)((long)peVar7 + lVar40 + -0x28));
              if ((pDVar27 == (DeepSlice *)0x0) || (*(int *)((long)peVar7 + lVar40 + -0x20) == 0)) {
                *(undefined1 (*) [16])((long)peVar7 + lVar40 + -8) = (undefined1  [16])0x0;
              }
              else {
                if (((pDVar27->super_Slice).xSampling != 1) ||
                   ((pDVar27->super_Slice).ySampling != 1)) {
                  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                  Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
                  goto LAB_00170e35;
                }
                lVar38 = lVar35;
                if ((pDVar27->super_Slice).xTileCoords != false) {
                  lVar38 = 0;
                }
                bVar4 = (pDVar27->super_Slice).yTileCoords;
                *(undefined2 *)((long)peVar7 + lVar40 + -0xc) =
                     *(undefined2 *)&(pDVar27->super_Slice).field_0x34;
                *(short *)((long)peVar7 + lVar40 + -10) = (short)(pDVar27->super_Slice).type;
                sVar8 = (pDVar27->super_Slice).xStride;
                *(int *)((long)peVar7 + lVar40 + -8) = (int)sVar8;
                sVar9 = (pDVar27->super_Slice).yStride;
                lVar44 = lVar36;
                if (bVar4 != false) {
                  lVar44 = 0;
                }
                *(int *)((long)peVar7 + lVar40 + -4) = (int)sVar9;
                *(char **)((long)&peVar7->channel_name + lVar40) =
                     (pDVar27->super_Slice).base + lVar44 * sVar9 + lVar38 * sVar8;
              }
              lVar47 = lVar47 + 1;
              lVar40 = lVar40 + 0x30;
            } while (lVar47 < (this->decoder).channel_count);
          }
          peVar1 = local_1d0;
          if ((uVar42 != (this->decoder).decode_flags) &&
             (iVar26 = exr_decoding_choose_default_routines(ctxt,pn,local_1d0), iVar26 != 0)) {
            this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to choose decoder routines");
            goto LAB_00170fa9;
          }
          iVar26 = exr_decoding_run(ctxt,pn,peVar1);
          auVar52._8_8_ = extraout_XMM1_Qb;
          auVar52._0_8_ = extraout_XMM1_Qa;
          this->last_decode_err = iVar26;
          if (iVar26 != 0) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,"Unable to run decoder: ",0x17);
            pcVar30 = (char *)exr_get_error_code_as_string(this->last_decode_err);
            std::operator<<(local_1a8,pcVar30);
            this_01 = (IoExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::IoExc::IoExc(this_01,local_1b8);
            __cxa_throw(this_01,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
          }
          pSVar28 = DeepFrameBuffer::getSampleCountSlice(outfb);
          if ((pSVar28->xSampling == 1) && (pSVar28->ySampling == 1)) {
            local_200 = (int)lVar35;
            local_208 = (int)lVar36;
            auVar51 = extraout_XMM0;
            if (0 < (this->cinfo).height) {
              uVar46 = 0;
              uVar32 = (long)local_200;
              if (pSVar28->xTileCoords != false) {
                uVar32 = uVar46;
              }
              sVar8 = pSVar28->xStride;
              sVar9 = pSVar28->yStride;
              uVar48 = (long)local_208;
              if (pSVar28->yTileCoords != false) {
                uVar48 = uVar46;
              }
              piVar49 = (int32_t *)(pSVar28->base + uVar48 * sVar9 + uVar32 * sVar8);
              do {
                iVar26 = (this->cinfo).width;
                piVar10 = (this->decoder).sample_count_table;
                iVar65 = (int)uVar46;
                if (sVar8 == 4) {
                  memcpy(piVar49,piVar10 + (long)iVar65 * (long)iVar26,(long)iVar26 << 2);
                  auVar51 = extraout_XMM0_00;
                }
                else if (0 < iVar26) {
                  lVar35 = 0;
                  piVar37 = piVar49;
                  do {
                    *piVar37 = piVar10[iVar26 * iVar65 + lVar35];
                    piVar37 = (int32_t *)((long)piVar37 + sVar8);
                    lVar35 = lVar35 + 1;
                  } while (lVar35 < (this->cinfo).width);
                }
                piVar49 = (int32_t *)((long)piVar49 + sVar9);
                uVar46 = (ulong)(iVar65 + 1U);
              } while ((int)(iVar65 + 1U) < (this->cinfo).height);
            }
            auVar25 = _DAT_001b34a0;
            if (this->counts_only == false) {
              pDVar29 = (local_1d8->
                        super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>)
                        ._M_impl.super__Vector_impl_data._M_start;
              pDVar11 = (local_1d8->
                        super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>)
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (pDVar29 != pDVar11) {
                piVar49 = (this->decoder).sample_count_table;
                do {
                  if (((pDVar29->super_Slice).xSampling != 1) ||
                     ((pDVar29->super_Slice).ySampling != 1)) {
                    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
                    goto LAB_00170e35;
                  }
                  if (0 < (this->cinfo).height) {
                    sVar8 = (pDVar29->super_Slice).xStride;
                    lVar35 = (long)local_200;
                    if ((pDVar29->super_Slice).xTileCoords != false) {
                      lVar35 = 0;
                    }
                    lVar36 = (long)local_208;
                    if ((pDVar29->super_Slice).yTileCoords != false) {
                      lVar36 = 0;
                    }
                    sVar9 = (pDVar29->super_Slice).yStride;
                    plVar45 = (long *)((pDVar29->super_Slice).base + lVar36 * sVar9 + lVar35 * sVar8
                                      );
                    lVar35 = 0;
                    do {
                      lVar36 = (long)(this->cinfo).width;
                      if (0 < lVar36) {
                        lVar40 = 0;
                        plVar41 = plVar45;
                        do {
                          uVar5 = piVar49[lVar36 * lVar35 + lVar40];
                          uVar32 = (ulong)uVar5;
                          if ((uVar32 != 0) && (lVar47 = *plVar41, lVar47 != 0)) {
                            PVar6 = (pDVar29->super_Slice).type;
                            if (PVar6 == FLOAT) {
                              if (0 < (int)uVar5) {
                                fVar33 = (float)(pDVar29->super_Slice).fillValue;
                                lVar38 = uVar32 - 1;
                                auVar71._8_4_ = (int)lVar38;
                                auVar71._0_8_ = lVar38;
                                auVar71._12_4_ = (int)((ulong)lVar38 >> 0x20);
                                auVar71 = auVar71 ^ auVar25;
                                lVar38 = 0;
                                auVar62 = _DAT_001b4270;
                                auVar76 = _DAT_001b4370;
                                do {
                                  auVar52 = auVar62 ^ auVar25;
                                  iVar26 = auVar71._4_4_;
                                  iVar65 = auVar71._12_4_;
                                  if ((bool)(~(auVar52._4_4_ == iVar26 &&
                                               auVar71._0_4_ < auVar52._0_4_ ||
                                              iVar26 < auVar52._4_4_) & 1)) {
                                    *(float *)(lVar47 + lVar38) = fVar33;
                                  }
                                  if ((auVar52._12_4_ != iVar65 || auVar52._8_4_ <= auVar71._8_4_)
                                      && auVar52._12_4_ <= iVar65) {
                                    *(float *)(lVar47 + 4 + lVar38) = fVar33;
                                  }
                                  auVar50 = auVar76 ^ auVar25;
                                  auVar52._0_4_ = -(uint)(auVar71._0_4_ < auVar50._0_4_);
                                  auVar52._4_4_ = -(uint)(iVar26 < auVar50._4_4_);
                                  auVar52._8_4_ = -(uint)(auVar71._8_4_ < auVar50._8_4_);
                                  auVar52._12_4_ = -(uint)(iVar65 < auVar50._12_4_);
                                  auVar51._4_4_ = -(uint)(auVar50._4_4_ == iVar26);
                                  auVar51._12_4_ = -(uint)(auVar50._12_4_ == iVar65);
                                  auVar51._0_4_ = auVar51._4_4_;
                                  auVar51._8_4_ = auVar51._12_4_;
                                  auVar51 = auVar51 & auVar52;
                                  auVar61._4_4_ = auVar52._4_4_;
                                  auVar61._0_4_ = auVar52._4_4_;
                                  auVar61._8_4_ = auVar52._12_4_;
                                  auVar61._12_4_ = auVar52._12_4_;
                                  auVar50._8_4_ = 0xffffffff;
                                  auVar50._0_8_ = 0xffffffffffffffff;
                                  auVar50._12_4_ = 0xffffffff;
                                  auVar50 = (auVar61 | auVar51) ^ auVar50;
                                  if ((auVar50 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                                    *(float *)(lVar47 + 8 + lVar38) = fVar33;
                                  }
                                  if ((auVar50 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                                    *(float *)(lVar47 + 0xc + lVar38) = fVar33;
                                  }
                                  lVar44 = auVar62._8_8_;
                                  auVar62._0_8_ = auVar62._0_8_ + 4;
                                  auVar62._8_8_ = lVar44 + 4;
                                  lVar44 = auVar76._8_8_;
                                  auVar76._0_8_ = auVar76._0_8_ + 4;
                                  auVar76._8_8_ = lVar44 + 4;
                                  lVar38 = lVar38 + 0x10;
                                } while ((ulong)(uVar5 + 3 >> 2) << 4 != lVar38);
                              }
                            }
                            else if (PVar6 == HALF) {
                              fVar60 = (float)(pDVar29->super_Slice).fillValue;
                              fVar33 = ABS(fVar60);
                              uVar42 = (ushort)((uint)fVar60 >> 0x10) & 0x8000;
                              if ((uint)fVar33 < 0x38800000) {
                                if ((0x33000000 < (uint)fVar33) &&
                                   (cVar24 = (char)((uint)fVar33 >> 0x17),
                                   uVar34 = (uint)fVar33 & 0x7fffff | 0x800000,
                                   uVar42 = uVar42 | (ushort)(uVar34 >> (0x7eU - cVar24 & 0x1f)),
                                   0x80000000 < uVar34 << (cVar24 + 0xa2U & 0x1f))) {
                                  uVar42 = uVar42 + 1;
                                }
                              }
                              else if ((uint)fVar33 < 0x7f800000) {
                                if ((uint)fVar33 < 0x477ff000) {
                                  uVar42 = (ushort)((int)fVar33 + 0x8000fff +
                                                    (uint)(((uint)fVar33 >> 0xd & 1) != 0) >> 0xd) |
                                           uVar42;
                                }
                                else {
                                  uVar42 = uVar42 | 0x7c00;
                                }
                              }
                              else {
                                uVar42 = uVar42 | 0x7c00;
                                if (fVar33 != INFINITY) {
                                  uVar34 = (uint)fVar33 >> 0xd & 0x3ff;
                                  uVar42 = uVar42 | (ushort)uVar34 | (ushort)(uVar34 == 0);
                                }
                              }
                              if (0 < (int)uVar5) {
                                lVar38 = uVar32 - 1;
                                lVar44 = 0;
                                auVar72 = _DAT_001b4270;
                                auVar75 = _DAT_001b4370;
                                auVar77 = _DAT_001b43a0;
                                auVar78 = _DAT_001b4390;
                                do {
                                  auVar80._8_4_ = (int)lVar38;
                                  auVar80._0_8_ = lVar38;
                                  auVar80._12_4_ = (int)((ulong)lVar38 >> 0x20);
                                  auVar80 = auVar80 ^ auVar25;
                                  auVar62 = auVar72 ^ auVar25;
                                  iVar79 = auVar80._0_4_;
                                  iVar66 = -(uint)(iVar79 < auVar62._0_4_);
                                  iVar82 = auVar80._4_4_;
                                  iVar67 = -(uint)(iVar82 < auVar62._4_4_);
                                  iVar83 = auVar80._8_4_;
                                  iVar68 = -(uint)(iVar83 < auVar62._8_4_);
                                  iVar84 = auVar80._12_4_;
                                  iVar69 = -(uint)(iVar84 < auVar62._12_4_);
                                  auVar18._4_4_ = iVar66;
                                  auVar18._0_4_ = iVar66;
                                  auVar18._8_4_ = iVar68;
                                  auVar18._12_4_ = iVar68;
                                  auVar51 = pshuflw(auVar51,auVar18,0xe8);
                                  iVar26 = -(uint)(auVar62._4_4_ == iVar82);
                                  iVar65 = -(uint)(auVar62._12_4_ == iVar84);
                                  auVar85._4_4_ = iVar26;
                                  auVar85._0_4_ = iVar26;
                                  auVar85._8_4_ = iVar65;
                                  auVar85._12_4_ = iVar65;
                                  auVar62 = pshuflw(auVar52,auVar85,0xe8);
                                  auVar86._4_4_ = iVar67;
                                  auVar86._0_4_ = iVar67;
                                  auVar86._8_4_ = iVar69;
                                  auVar86._12_4_ = iVar69;
                                  auVar52 = pshuflw(auVar51,auVar86,0xe8);
                                  auVar53._8_4_ = 0xffffffff;
                                  auVar53._0_8_ = 0xffffffffffffffff;
                                  auVar53._12_4_ = 0xffffffff;
                                  auVar53 = (auVar52 | auVar62 & auVar51) ^ auVar53;
                                  auVar52 = packssdw(auVar53,auVar53);
                                  if ((auVar52 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                                    *(ushort *)(lVar47 + lVar44) = uVar42;
                                  }
                                  auVar19._4_4_ = iVar66;
                                  auVar19._0_4_ = iVar66;
                                  auVar19._8_4_ = iVar68;
                                  auVar19._12_4_ = iVar68;
                                  auVar86 = auVar85 & auVar19 | auVar86;
                                  auVar52 = packssdw(auVar86,auVar86);
                                  auVar12._8_4_ = 0xffffffff;
                                  auVar12._0_8_ = 0xffffffffffffffff;
                                  auVar12._12_4_ = 0xffffffff;
                                  auVar52 = packssdw(auVar52 ^ auVar12,auVar52 ^ auVar12);
                                  if ((auVar52._0_4_ >> 0x10 & 1) != 0) {
                                    *(ushort *)(lVar47 + 2 + lVar44) = uVar42;
                                  }
                                  auVar52 = auVar75 ^ auVar25;
                                  auVar57._0_4_ = -(uint)(iVar79 < auVar52._0_4_);
                                  auVar57._4_4_ = -(uint)(iVar82 < auVar52._4_4_);
                                  auVar57._8_4_ = -(uint)(iVar83 < auVar52._8_4_);
                                  auVar57._12_4_ = -(uint)(iVar84 < auVar52._12_4_);
                                  auVar87._4_4_ = auVar57._0_4_;
                                  auVar87._0_4_ = auVar57._0_4_;
                                  auVar87._8_4_ = auVar57._8_4_;
                                  auVar87._12_4_ = auVar57._8_4_;
                                  iVar26 = -(uint)(auVar52._4_4_ == iVar82);
                                  iVar65 = -(uint)(auVar52._12_4_ == iVar84);
                                  auVar20._4_4_ = iVar26;
                                  auVar20._0_4_ = iVar26;
                                  auVar20._8_4_ = iVar65;
                                  auVar20._12_4_ = iVar65;
                                  auVar63._4_4_ = auVar57._4_4_;
                                  auVar63._0_4_ = auVar57._4_4_;
                                  auVar63._8_4_ = auVar57._12_4_;
                                  auVar63._12_4_ = auVar57._12_4_;
                                  auVar52 = auVar20 & auVar87 | auVar63;
                                  auVar52 = packssdw(auVar52,auVar52);
                                  auVar13._8_4_ = 0xffffffff;
                                  auVar13._0_8_ = 0xffffffffffffffff;
                                  auVar13._12_4_ = 0xffffffff;
                                  auVar52 = packssdw(auVar52 ^ auVar13,auVar52 ^ auVar13);
                                  if ((auVar52 & (undefined1  [16])0x100000000) !=
                                      (undefined1  [16])0x0) {
                                    *(ushort *)(lVar47 + 4 + lVar44) = uVar42;
                                  }
                                  auVar52 = pshufhw(auVar52,auVar87,0x84);
                                  auVar21._4_4_ = iVar26;
                                  auVar21._0_4_ = iVar26;
                                  auVar21._8_4_ = iVar65;
                                  auVar21._12_4_ = iVar65;
                                  auVar62 = pshufhw(auVar57,auVar21,0x84);
                                  auVar51 = pshufhw(auVar52,auVar63,0x84);
                                  auVar54._8_4_ = 0xffffffff;
                                  auVar54._0_8_ = 0xffffffffffffffff;
                                  auVar54._12_4_ = 0xffffffff;
                                  auVar54 = (auVar51 | auVar62 & auVar52) ^ auVar54;
                                  auVar52 = packssdw(auVar54,auVar54);
                                  if ((auVar52 & (undefined1  [16])0x1000000000000) !=
                                      (undefined1  [16])0x0) {
                                    *(ushort *)(lVar47 + 6 + lVar44) = uVar42;
                                  }
                                  auVar52 = auVar77 ^ auVar25;
                                  auVar58._0_4_ = -(uint)(iVar79 < auVar52._0_4_);
                                  auVar58._4_4_ = -(uint)(iVar82 < auVar52._4_4_);
                                  auVar58._8_4_ = -(uint)(iVar83 < auVar52._8_4_);
                                  auVar58._12_4_ = -(uint)(iVar84 < auVar52._12_4_);
                                  auVar22._4_4_ = auVar58._0_4_;
                                  auVar22._0_4_ = auVar58._0_4_;
                                  auVar22._8_4_ = auVar58._8_4_;
                                  auVar22._12_4_ = auVar58._8_4_;
                                  auVar62 = pshuflw(auVar63,auVar22,0xe8);
                                  auVar55._0_4_ = -(uint)(auVar52._0_4_ == iVar79);
                                  auVar55._4_4_ = -(uint)(auVar52._4_4_ == iVar82);
                                  auVar55._8_4_ = -(uint)(auVar52._8_4_ == iVar83);
                                  auVar55._12_4_ = -(uint)(auVar52._12_4_ == iVar84);
                                  auVar88._4_4_ = auVar55._4_4_;
                                  auVar88._0_4_ = auVar55._4_4_;
                                  auVar88._8_4_ = auVar55._12_4_;
                                  auVar88._12_4_ = auVar55._12_4_;
                                  auVar52 = pshuflw(auVar55,auVar88,0xe8);
                                  auVar89._4_4_ = auVar58._4_4_;
                                  auVar89._0_4_ = auVar58._4_4_;
                                  auVar89._8_4_ = auVar58._12_4_;
                                  auVar89._12_4_ = auVar58._12_4_;
                                  auVar51 = pshuflw(auVar58,auVar89,0xe8);
                                  auVar14._8_4_ = 0xffffffff;
                                  auVar14._0_8_ = 0xffffffffffffffff;
                                  auVar14._12_4_ = 0xffffffff;
                                  auVar52 = packssdw(auVar52 & auVar62,
                                                     (auVar51 | auVar52 & auVar62) ^ auVar14);
                                  if ((auVar52 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                                    *(ushort *)(lVar47 + 8 + lVar44) = uVar42;
                                  }
                                  auVar23._4_4_ = auVar58._0_4_;
                                  auVar23._0_4_ = auVar58._0_4_;
                                  auVar23._8_4_ = auVar58._8_4_;
                                  auVar23._12_4_ = auVar58._8_4_;
                                  auVar89 = auVar88 & auVar23 | auVar89;
                                  auVar51 = packssdw(auVar89,auVar89);
                                  auVar15._8_4_ = 0xffffffff;
                                  auVar15._0_8_ = 0xffffffffffffffff;
                                  auVar15._12_4_ = 0xffffffff;
                                  auVar52 = packssdw(auVar52,auVar51 ^ auVar15);
                                  if ((auVar52 & (undefined1  [16])0x10000) != (undefined1  [16])0x0
                                     ) {
                                    *(ushort *)(lVar47 + 10 + lVar44) = uVar42;
                                  }
                                  auVar52 = auVar78 ^ auVar25;
                                  auVar59._0_4_ = -(uint)(iVar79 < auVar52._0_4_);
                                  auVar59._4_4_ = -(uint)(iVar82 < auVar52._4_4_);
                                  auVar59._8_4_ = -(uint)(iVar83 < auVar52._8_4_);
                                  auVar59._12_4_ = -(uint)(iVar84 < auVar52._12_4_);
                                  auVar90._4_4_ = auVar59._0_4_;
                                  auVar90._0_4_ = auVar59._0_4_;
                                  auVar90._8_4_ = auVar59._8_4_;
                                  auVar90._12_4_ = auVar59._8_4_;
                                  iVar26 = -(uint)(auVar52._4_4_ == iVar82);
                                  iVar65 = -(uint)(auVar52._12_4_ == iVar84);
                                  auVar64._4_4_ = iVar26;
                                  auVar64._0_4_ = iVar26;
                                  auVar64._8_4_ = iVar65;
                                  auVar64._12_4_ = iVar65;
                                  auVar81._4_4_ = auVar59._4_4_;
                                  auVar81._0_4_ = auVar59._4_4_;
                                  auVar81._8_4_ = auVar59._12_4_;
                                  auVar81._12_4_ = auVar59._12_4_;
                                  auVar52 = auVar64 & auVar90 | auVar81;
                                  auVar52 = packssdw(auVar52,auVar52);
                                  auVar16._8_4_ = 0xffffffff;
                                  auVar16._0_8_ = 0xffffffffffffffff;
                                  auVar16._12_4_ = 0xffffffff;
                                  auVar52 = packssdw(auVar52 ^ auVar16,auVar52 ^ auVar16);
                                  if ((auVar52 & (undefined1  [16])0x100000000) !=
                                      (undefined1  [16])0x0) {
                                    *(ushort *)(lVar47 + 0xc + lVar44) = uVar42;
                                  }
                                  auVar51 = pshufhw(auVar52,auVar90,0x84);
                                  auVar52 = pshufhw(auVar59,auVar64,0x84);
                                  auVar52 = auVar52 & auVar51;
                                  auVar51 = pshufhw(auVar51,auVar81,0x84);
                                  auVar56._8_4_ = 0xffffffff;
                                  auVar56._0_8_ = 0xffffffffffffffff;
                                  auVar56._12_4_ = 0xffffffff;
                                  auVar56 = (auVar51 | auVar52) ^ auVar56;
                                  auVar51 = packssdw(auVar56,auVar56);
                                  if ((auVar51 & (undefined1  [16])0x1000000000000) !=
                                      (undefined1  [16])0x0) {
                                    *(ushort *)(lVar47 + 0xe + lVar44) = uVar42;
                                  }
                                  lVar73 = auVar72._8_8_;
                                  auVar72._0_8_ = auVar72._0_8_ + 8;
                                  auVar72._8_8_ = lVar73 + 8;
                                  lVar73 = auVar75._8_8_;
                                  auVar75._0_8_ = auVar75._0_8_ + 8;
                                  auVar75._8_8_ = lVar73 + 8;
                                  lVar73 = auVar77._8_8_;
                                  auVar77._0_8_ = auVar77._0_8_ + 8;
                                  auVar77._8_8_ = lVar73 + 8;
                                  lVar73 = auVar78._8_8_;
                                  auVar78._0_8_ = auVar78._0_8_ + 8;
                                  auVar78._8_8_ = lVar73 + 8;
                                  lVar44 = lVar44 + 0x10;
                                } while ((ulong)(uVar5 + 7 >> 3) << 4 != lVar44);
                              }
                            }
                            else {
                              if (PVar6 != UINT) {
                                this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                                Iex_3_4::ArgExc::ArgExc(this_00,"Unknown pixel data type.");
                                goto LAB_00170e35;
                              }
                              if (0 < (int)uVar5) {
                                dVar3 = (pDVar29->super_Slice).fillValue;
                                lVar44 = uVar32 - 1;
                                lVar38 = 0;
                                auVar70 = _DAT_001b4270;
                                auVar74 = _DAT_001b4370;
                                do {
                                  auVar17._8_4_ = (int)lVar44;
                                  auVar17._0_8_ = lVar44;
                                  auVar17._12_4_ = (int)((ulong)lVar44 >> 0x20);
                                  iVar26 = SUB164(auVar17 ^ auVar25,0);
                                  bVar4 = iVar26 < SUB164(auVar70 ^ auVar25,0);
                                  iVar65 = SUB164(auVar17 ^ auVar25,4);
                                  iVar66 = SUB164(auVar70 ^ auVar25,4);
                                  uVar31 = (undefined4)(long)dVar3;
                                  if ((bool)(~(iVar65 < iVar66 || iVar66 == iVar65 && bVar4) & 1)) {
                                    *(undefined4 *)(lVar47 + lVar38) = uVar31;
                                  }
                                  if (iVar65 >= iVar66 && (iVar66 != iVar65 || !bVar4)) {
                                    *(undefined4 *)(lVar47 + 4 + lVar38) = uVar31;
                                  }
                                  iVar66 = SUB164(auVar74 ^ auVar25,4);
                                  if (iVar66 <= iVar65 &&
                                      (iVar66 != iVar65 || SUB164(auVar74 ^ auVar25,0) <= iVar26)) {
                                    *(undefined4 *)(lVar47 + 8 + lVar38) = uVar31;
                                    *(undefined4 *)(lVar47 + 0xc + lVar38) = uVar31;
                                  }
                                  lVar73 = auVar70._8_8_;
                                  auVar70._0_8_ = auVar70._0_8_ + 4;
                                  auVar70._8_8_ = lVar73 + 4;
                                  lVar73 = auVar74._8_8_;
                                  auVar74._0_8_ = auVar74._0_8_ + 4;
                                  auVar74._8_8_ = lVar73 + 4;
                                  lVar38 = lVar38 + 0x10;
                                } while ((ulong)(uVar5 + 3 >> 2) << 4 != lVar38);
                              }
                            }
                          }
                          plVar41 = (long *)((long)plVar41 + sVar8);
                          lVar40 = lVar40 + 1;
                        } while (lVar40 < (this->cinfo).width);
                      }
                      plVar45 = (long *)((long)plVar45 + sVar9);
                      lVar35 = lVar35 + 1;
                    } while (lVar35 < (this->cinfo).height);
                  }
                  pDVar29 = pDVar29 + 1;
                } while (pDVar29 != pDVar11);
              }
            }
            return;
          }
          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
        }
        else {
          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_00,"Unable to query the data window.");
        }
      }
      else {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"Unable to query the data window.");
      }
LAB_00170e35:
      puVar43 = &Iex_3_4::ArgExc::typeinfo;
      pcVar39 = Iex_3_4::ArgExc::~ArgExc;
      goto LAB_00170e43;
    }
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to initialize decode pipeline");
  }
  else {
    iVar26 = exr_decoding_update(ctxt,pn,&this->cinfo,peVar1);
    if (iVar26 == 0) {
      uVar42 = (ushort)(byte)(this->decoder).decode_flags;
      goto LAB_00170519;
    }
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to update decode pipeline");
  }
LAB_00170fa9:
  puVar43 = &Iex_3_4::IoExc::typeinfo;
  pcVar39 = Iex_3_4::IoExc::~IoExc;
LAB_00170e43:
  __cxa_throw(this_00,puVar43,pcVar39);
}

Assistant:

void TileProcess::run_decode (
    exr_const_context_t ctxt,
    int pn,
    const DeepFrameBuffer *outfb,
    const std::vector<DeepSlice> &filllist)
{
    int absX, absY, tileX, tileY;
    exr_attr_box2i_t dw;
    uint8_t flags;

    if (first)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");
        }
        decoder.decode_flags |= EXR_DECODE_NON_IMAGE_DATA_AS_POINTERS;
        decoder.decode_flags |= EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL;
        flags = 0;

        first = false;
    }
    else
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_update (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to update decode pipeline");
        }
        flags = decoder.decode_flags;
    }

    if (EXR_ERR_SUCCESS != exr_get_data_window (ctxt, pn, &dw))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    if (EXR_ERR_SUCCESS != exr_get_tile_sizes (
            ctxt, pn, cinfo.level_x, cinfo.level_y, &tileX, &tileY))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    absX = dw.min.x + tileX * cinfo.start_x;
    absY = dw.min.y + tileY * cinfo.start_y;

    if (counts_only)
        decoder.decode_flags |= EXR_DECODE_SAMPLE_DATA_ONLY;
    else
        decoder.decode_flags = decoder.decode_flags & ~EXR_DECODE_SAMPLE_DATA_ONLY;

    update_pointers (outfb, dw.min.x, dw.min.y, absX, absY);

    if (flags != decoder.decode_flags)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_choose_default_routines (ctxt, pn, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
        }
    }

    last_decode_err = exr_decoding_run (ctxt, pn, &decoder);
    if (EXR_ERR_SUCCESS != last_decode_err)
    {
        THROW (
            IEX_NAMESPACE::IoExc,
            "Unable to run decoder: "
            << exr_get_error_code_as_string (last_decode_err));
    }

    copy_sample_count (outfb, dw.min.x, dw.min.y, absX, absY);

    if (counts_only)
        return;

    run_fill (outfb, dw.min.x, dw.min.y, absX, absY, filllist);
}